

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int * Dau_DsdNormalizePerm(char *pStr,int *pMarks,int nMarks)

{
  int iVar1;
  int local_28;
  int t;
  int iBest;
  int k;
  int i;
  int nMarks_local;
  int *pMarks_local;
  char *pStr_local;
  
  for (iBest = 0; iBest < nMarks; iBest = iBest + 1) {
    Dau_DsdNormalizePerm::pPerm[iBest] = iBest;
  }
  for (iBest = 0; iBest < nMarks; iBest = iBest + 1) {
    local_28 = iBest;
    t = iBest;
    while (t = t + 1, t < nMarks) {
      iVar1 = Dau_DsdNormalizeCompare
                        (pStr,pMarks,Dau_DsdNormalizePerm::pPerm[local_28],
                         Dau_DsdNormalizePerm::pPerm[t]);
      if (iVar1 == 1) {
        local_28 = t;
      }
    }
    iVar1 = Dau_DsdNormalizePerm::pPerm[iBest];
    Dau_DsdNormalizePerm::pPerm[iBest] = Dau_DsdNormalizePerm::pPerm[local_28];
    Dau_DsdNormalizePerm::pPerm[local_28] = iVar1;
  }
  return Dau_DsdNormalizePerm::pPerm;
}

Assistant:

int * Dau_DsdNormalizePerm( char * pStr, int * pMarks, int nMarks )
{
    static int pPerm[DAU_MAX_VAR];
    int i, k;
    for ( i = 0; i < nMarks; i++ )
        pPerm[i] = i;
    for ( i = 0; i < nMarks; i++ )
    {
        int iBest = i;
        for ( k = i + 1; k < nMarks; k++ )
            if ( Dau_DsdNormalizeCompare( pStr, pMarks, pPerm[iBest], pPerm[k] ) == 1 )
                iBest = k;
        ABC_SWAP( int, pPerm[i], pPerm[iBest] );
    }
    return pPerm;
}